

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O0

int __thiscall MyObserver::on_exit(MyObserver *this,__func *__func,void *__arg)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  string *psVar4;
  ostringstream oss;
  string local_1c0 [48];
  ostringstream local_190 [376];
  MyObserver *local_18;
  TaskView local_10;
  WorkerView local_8;
  
  local_18 = this;
  local_10._node = (Node *)__arg;
  local_8._worker = (Worker *)__func;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"worker ");
  sVar3 = tf::WorkerView::id(&local_8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," finished running ");
  psVar4 = tf::TaskView::name_abi_cxx11_(&local_10);
  poVar2 = std::operator<<(poVar2,(string *)psVar4);
  std::operator<<(poVar2,'\n');
  std::__cxx11::ostringstream::str();
  std::operator<<((ostream *)&std::cout,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  iVar1 = std::__cxx11::ostringstream::~ostringstream(local_190);
  return iVar1;
}

Assistant:

void on_exit(tf::WorkerView wv, tf::TaskView tv) override final {
    std::ostringstream oss;
    oss << "worker " << wv.id() << " finished running " << tv.name() << '\n';
    std::cout << oss.str();
  }